

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O0

sysbvm_tuple_t sysbvm_integer_normalize(sysbvm_context_t *context,sysbvm_integer_t *integer)

{
  ulong value;
  size_t sVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_object_tuple_t *psVar3;
  bool bVar4;
  sysbvm_integer_t *normalizedResult;
  uint64_t valueUInt64;
  _Bool isNegative;
  sysbvm_tuple_t largeIntegerType;
  size_t normalizedWordCount;
  size_t wordCount;
  sysbvm_integer_t *integer_local;
  sysbvm_context_t *context_local;
  
  sVar1 = sysbvm_tuple_getSizeInBytes((sysbvm_tuple_t)integer);
  largeIntegerType = sVar1 >> 2;
  while( true ) {
    bVar4 = false;
    if (largeIntegerType != 0) {
      bVar4 = integer->words[largeIntegerType - 1] != 0;
    }
    if (!bVar4) break;
    largeIntegerType = largeIntegerType - 1;
  }
  context_local = (sysbvm_context_t *)integer;
  if (largeIntegerType != sVar1 >> 2) {
    if (largeIntegerType == 0) {
      context_local = (sysbvm_context_t *)sysbvm_tuple_integer_encodeSmall(0);
    }
    else {
      sVar2 = sysbvm_tuple_getType(context,(sysbvm_tuple_t)integer);
      if (largeIntegerType < 3) {
        value = *(ulong *)integer->words;
        if (sVar2 == (context->roots).largeNegativeIntegerType) {
          if (value < 0x800000000000001) {
            sVar2 = sysbvm_tuple_integer_encodeSmall(-value);
            return sVar2;
          }
        }
        else if (value < 0x800000000000000) {
          sVar2 = sysbvm_tuple_integer_encodeSmall(value);
          return sVar2;
        }
      }
      psVar3 = sysbvm_context_allocateByteTuple(context,sVar2,largeIntegerType << 2);
      memcpy(&psVar3->field_1,integer->words,largeIntegerType << 2);
      context_local = (sysbvm_context_t *)largeIntegerType;
    }
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_integer_normalize(sysbvm_context_t *context, sysbvm_integer_t *integer)
{
    // Counte the required number of normalized words.
    size_t wordCount = sysbvm_tuple_getSizeInBytes((sysbvm_tuple_t)integer) / 4;
    size_t normalizedWordCount = wordCount;
    while(normalizedWordCount > 0 && integer->words[normalizedWordCount - 1])
        --normalizedWordCount;

    // Trivial cases.
    if(normalizedWordCount == wordCount)
    {
        return (sysbvm_tuple_t)integer;
    }
    else if(normalizedWordCount == 0)
    {
        return sysbvm_tuple_integer_encodeSmall(0);
    }
    
    // Attempt to fit in an immediate, if possible.
    sysbvm_tuple_t largeIntegerType = sysbvm_tuple_getType(context, (sysbvm_tuple_t)integer);
    bool isNegative = largeIntegerType == context->roots.largeNegativeIntegerType;
    if(normalizedWordCount <= 2)
    {
        uint64_t valueUInt64 = (uint64_t)integer->words[0] | ((uint64_t)integer->words[1] << 32);
        if(isNegative)
        {
            if(valueUInt64 <= (uint64_t)-SYSBVM_IMMEDIATE_INT_MIN)
                return (sysbvm_tuple_t)sysbvm_tuple_integer_encodeSmall(-(sysbvm_stuple_t)valueUInt64);
        }
        else
        {
            if(valueUInt64 <= SYSBVM_IMMEDIATE_INT_MAX)
                return (sysbvm_tuple_t)sysbvm_tuple_integer_encodeSmall((sysbvm_stuple_t)valueUInt64);
        }
    }

    // Make a newer smaller large integer.
    sysbvm_integer_t *normalizedResult = (sysbvm_integer_t*)sysbvm_context_allocateByteTuple(context, largeIntegerType, normalizedWordCount*4);
    memcpy(normalizedResult->words, integer->words, 4*normalizedWordCount);
    return (sysbvm_tuple_t)normalizedWordCount;
}